

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

int quote_dname(char *dir)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char fbuf [256];
  
  pcVar2 = fbuf;
  pcVar3 = dir;
  do {
    cVar1 = *pcVar3;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      pcVar4 = pcVar2 + 1;
      *pcVar2 = '\'';
      lVar5 = 2;
    }
    else {
      pcVar4 = pcVar2;
      lVar5 = 1;
      if (cVar1 == '\0') {
        *pcVar2 = '\0';
        if (pcVar2[-1] == '.') {
          pcVar2[-1] = '\'';
          pcVar2[0] = '.';
        }
        strcpy(dir,fbuf);
        return 1;
      }
    }
    pcVar2 = pcVar2 + lVar5;
    *pcVar4 = cVar1;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

int quote_dname(char *dir)
{
  char *cp, *dp;
  char fbuf[MAXNAMLEN + 1];

  cp = dir;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  if (*(dp - 1) == '.') {
    /* Trail period should be quoted. */
    *(dp - 1) = '\'';
    *dp++ = '.';
  }

  strcpy(dir, fbuf);
  return (1);
}